

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

void __thiscall rsg::ValueRange::ValueRange(ValueRange *this,VariableType *type)

{
  int iVar1;
  allocator<rsg::Scalar> local_26;
  allocator<rsg::Scalar> local_25 [13];
  VariableType *local_18;
  VariableType *type_local;
  ValueRange *this_local;
  
  local_18 = type;
  type_local = &this->m_type;
  VariableType::VariableType(&this->m_type,type);
  iVar1 = VariableType::getScalarSize(local_18);
  std::allocator<rsg::Scalar>::allocator(local_25);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_min,(long)iVar1,local_25);
  std::allocator<rsg::Scalar>::~allocator(local_25);
  iVar1 = VariableType::getScalarSize(local_18);
  std::allocator<rsg::Scalar>::allocator(&local_26);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_max,(long)iVar1,&local_26)
  ;
  std::allocator<rsg::Scalar>::~allocator(&local_26);
  return;
}

Assistant:

ValueRange::ValueRange (const VariableType& type)
	: m_type		(type)
	, m_min			(type.getScalarSize())
	, m_max			(type.getScalarSize())
{
}